

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FusionEKF.cpp
# Opt level: O0

void __thiscall FusionEKF::ProcessMeasurement(FusionEKF *this,MeasurementPackage *measurement_pack)

{
  CoeffReturnType pdVar1;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar2;
  Scalar *pSVar3;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar4;
  MatrixXd *this_00;
  double dVar5;
  double local_168;
  Scalar local_160;
  double local_158;
  Scalar local_150;
  Scalar local_148;
  double local_140;
  Scalar local_138;
  double local_130;
  double local_128;
  Scalar local_120;
  double local_118;
  Scalar local_110;
  Scalar local_108;
  double local_100;
  Scalar local_f8;
  double local_f0;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_e8;
  int local_c8 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_c0;
  float local_a8;
  float local_a4;
  float dt_4;
  float dt_3;
  float dt_2;
  float dt;
  Scalar local_90;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_88;
  Scalar local_68;
  Scalar local_60;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_58;
  Matrix<double,__1,_1,_0,__1,_1> local_28;
  MeasurementPackage *local_18;
  MeasurementPackage *measurement_pack_local;
  FusionEKF *this_local;
  
  local_18 = measurement_pack;
  measurement_pack_local = (MeasurementPackage *)this;
  if ((this->is_initialized_ & 1U) == 0) {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&local_28,4);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(&(this->ekf_).x_,&local_28);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_28);
    if (local_18->sensor_type_ == RADAR) {
      pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &local_18->raw_measurements_,0);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
                (&local_58,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&(this->ekf_).x_,
                 pdVar1);
      pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &local_18->raw_measurements_,1);
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (&local_58,pdVar1);
      local_60 = 0.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar2,&local_60);
      local_68 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar2,&local_68);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_58)
      ;
    }
    else if (local_18->sensor_type_ == LASER) {
      pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &local_18->raw_measurements_,0);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
                (&local_88,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&(this->ekf_).x_,
                 pdVar1);
      pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &local_18->raw_measurements_,1);
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (&local_88,pdVar1);
      local_90 = 0.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar2,&local_90);
      _dt_2 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                (pCVar2,(Scalar *)&dt_2);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_88)
      ;
    }
    this->previous_timestamp_ = local_18->timestamp_;
    this->is_initialized_ = true;
  }
  else {
    dt_3 = (float)((double)(measurement_pack->timestamp_ - this->previous_timestamp_) / 1000000.0);
    this->previous_timestamp_ = measurement_pack->timestamp_;
    dt_4 = dt_3 * dt_3;
    local_a4 = dt_4 * dt_3;
    local_a8 = local_a4 * dt_3;
    dVar5 = (double)dt_3;
    this_00 = &(this->ekf_).F_;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_00,0,2)
    ;
    *pSVar3 = dVar5;
    dVar5 = (double)dt_3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_00,1,3)
    ;
    *pSVar3 = dVar5;
    local_c8[1] = 4;
    local_c8[0] = 4;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_c0,local_c8 + 1,local_c8);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).Q_,&local_c0);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_c0);
    local_f0 = (double)(local_a8 * 0.25 * this->noise_ax);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
              (&local_e8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&(this->ekf_).Q_,
               &local_f0);
    local_f8 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_e8,&local_f8);
    local_100 = (double)(local_a4 * 0.5 * this->noise_ax);
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_100);
    local_108 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_108);
    local_110 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_110);
    local_118 = (double)(local_a8 * 0.25 * this->noise_ay);
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_118);
    local_120 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_120);
    local_128 = (double)(local_a4 * 0.5 * this->noise_ay);
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_128);
    local_130 = (double)(local_a4 * 0.5 * this->noise_ax);
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_130);
    local_138 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_138);
    local_140 = (double)(dt_4 * this->noise_ax);
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_140);
    local_148 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_148);
    local_150 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_150);
    local_158 = (double)(local_a4 * 0.5 * this->noise_ay);
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_158);
    local_160 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_160);
    local_168 = (double)(dt_4 * this->noise_ay);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar4,&local_168)
    ;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_e8)
    ;
    KalmanFilter::Predict(&this->ekf_);
    if (local_18->sensor_type_ == RADAR) {
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).H_,&this->H_radar_);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).R_,&this->R_radar_);
      KalmanFilter::Update(&this->ekf_,&local_18->raw_measurements_);
    }
    else {
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).H_,&this->H_laser_);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).R_,&this->R_laser_);
      KalmanFilter::Update(&this->ekf_,&local_18->raw_measurements_);
    }
  }
  return;
}

Assistant:

void FusionEKF::ProcessMeasurement(const MeasurementPackage &measurement_pack) {


  /*****************************************************************************
   *  Initialization
   ****************************************************************************/
  if (!is_initialized_) {

    // first measurement
   // cout << "EKF: " << endl;
    ekf_.x_ = VectorXd(4);

    if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
      /**
          Initialize state. cheked
      */

       ekf_.x_ << measurement_pack.raw_measurements_[0], measurement_pack.raw_measurements_[1], 0, 0; // x, y, vx, vy
    }
    else if (measurement_pack.sensor_type_ == MeasurementPackage::LASER) {
      /**
      Initialize state.cheked
      */
      ekf_.x_ << measurement_pack.raw_measurements_[0], measurement_pack.raw_measurements_[1], 0, 0; // x, y, vx, vy
    }


    previous_timestamp_ = measurement_pack.timestamp_;

    // done initializing, no need to predict or update
    is_initialized_ = true;
    return;
  }

  /*****************************************************************************
   *  Prediction (laser)
   ****************************************************************************/

  /**
     * Update the state transition matrix F according to the new elapsed time.
      - Time is measured in seconds.
     * Update the process noise covariance matrix.
     * Use noise_ax = 9 and noise_ay = 9 for your Q matrix.
   */

  // compute the time elapsed between the current and previous measurements (0.05 seconds)
  float dt = (measurement_pack.timestamp_ - previous_timestamp_) / 1000000.0;  //  in seconds
  previous_timestamp_ = measurement_pack.timestamp_;

// time difference is 0.05 seconds

//dt power of 4, 3,2 need for Q matrix cheked

  float dt_2 = dt * dt;
  float dt_3 = dt_2 * dt;
  float dt_4 = dt_3 * dt;

  // Modify the F matrix so that the time is integrated
  ekf_.F_(0, 2) = dt;
  ekf_.F_(1, 3) = dt;

  //set the process covariance matrix Q  cheked
  ekf_.Q_ = MatrixXd(4, 4);
  ekf_.Q_ << dt_4/4*noise_ax,   0,                dt_3/2*noise_ax,  0,
             0,                 dt_4/4*noise_ay,  0,                dt_3/2*noise_ay,
             dt_3/2*noise_ax,   0,                dt_2*noise_ax,    0,
             0,                 dt_3/2*noise_ay,  0,                dt_2*noise_ay;

  ekf_.Predict();

  /*****************************************************************************
   *  Update
   ****************************************************************************/

  /**
     * Use the sensor type to perform the update step.
     * Update the state and covariance matrices.
   */

  if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
    // Radar updates  cheked
    ekf_.H_ = H_radar_;
    ekf_.R_ = R_radar_;
    ekf_.Update(measurement_pack.raw_measurements_);
  }
  else {
    // Laser updates  cheked
    ekf_.H_ = H_laser_;
    ekf_.R_ = R_laser_;
    ekf_.Update(measurement_pack.raw_measurements_);
  }

  // print the output
 // cout << "x_ = " << ekf_.x_ << endl;
 // cout << "P_ = " << ekf_.P_ << endl;
}